

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int BN_clear_bit(BIGNUM *a,int n)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((-1 < n) && ((int)((uint)n >> 6) < a->top)) {
    bVar1 = (byte)n & 0x3f;
    a->d[(uint)n >> 6] = a->d[(uint)n >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    bn_correct_top((BIGNUM *)a);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int BN_clear_bit(BIGNUM *a, int n)
{
    int i, j;

    bn_check_top(a);
    if (n < 0)
        return 0;

    i = n / BN_BITS2;
    j = n % BN_BITS2;
    if (a->top <= i)
        return (0);

    a->d[i] &= (~(((BN_ULONG)1) << j));
    bn_correct_top(a);
    return (1);
}